

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall Minisat::BoolOption::help(BoolOption *this,bool verbose)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  uint32_t i;
  ulong uVar4;
  
  fprintf(_stderr,"  -%s, -no-%s",(this->super_Option).name);
  uVar4 = 0;
  do {
    sVar2 = strlen((this->super_Option).name);
    fputc(0x20,_stderr);
    bVar1 = uVar4 < sVar2 * -2 + 0x20;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (bVar1);
  pcVar3 = "off";
  if (this->value != false) {
    pcVar3 = "on";
  }
  fprintf(_stderr,"(default: %s)\n",pcVar3);
  if (!verbose) {
    return;
  }
  fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
  fputc(10,_stderr);
  return;
}

Assistant:

virtual void help (bool verbose = false){

        fprintf(stderr, "  -%s, -no-%s", name, name);

        for (uint32_t i = 0; i < 32 - strlen(name)*2; i++)
            fprintf(stderr, " ");

        fprintf(stderr, " ");
        fprintf(stderr, "(default: %s)\n", value ? "on" : "off");
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }